

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O3

bool duckdb_re2::RegexSearchInternal
               (char *input_data,size_t input_size,Match *match,RE2 *regex,Anchor anchor,
               size_t start,size_t end)

{
  pointer pSVar1;
  bool bVar2;
  size_type __new_size;
  pointer pSVar3;
  GroupMatch group_match;
  vector<duckdb_re2::StringPiece,_true> target_groups;
  GroupMatch local_90;
  vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_start = (StringPiece *)0x0;
  local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_finish = (StringPiece *)0x0;
  local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (long)regex->num_captures_ + 1;
  duckdb::std::vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>::resize
            (&local_68,__new_size);
  duckdb::std::vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>::clear
            ((vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_> *)match);
  local_90.text._M_dataplus._M_p = input_data;
  local_90.text._M_string_length = input_size;
  bVar2 = RE2::Match(regex,(StringPiece *)&local_90,start,end,anchor,
                     local_68.
                     super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
                     ._M_impl.super__Vector_impl_data._M_start,(int)__new_size);
  pSVar1 = local_68.
           super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((bVar2) &&
     (local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pSVar3 = local_68.
             super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_90.text._M_dataplus._M_p = (pointer)&local_90.text.field_2;
      local_90.text._M_string_length = 0;
      local_90.text.field_2._M_local_buf[0] = '\0';
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,pSVar3->data_,pSVar3->data_ + pSVar3->size_);
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (pSVar3->data_ == (const_pointer)0x0) {
        local_90.position = 0;
      }
      else {
        local_90.position =
             duckdb::NumericCastImpl<unsigned_int,_long,_false>::Convert
                       ((long)pSVar3->data_ - (long)input_data);
      }
      std::vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>>::
      emplace_back<duckdb_re2::GroupMatch&>
                ((vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>> *)match,
                 &local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.text._M_dataplus._M_p != &local_90.text.field_2) {
        operator_delete(local_90.text._M_dataplus._M_p);
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  if (local_68.super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
      ._M_impl.super__Vector_impl_data._M_start != (StringPiece *)0x0) {
    operator_delete(local_68.
                    super__Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool RegexSearchInternal(const char *input_data, size_t input_size, Match &match, const RE2 &regex, RE2::Anchor anchor,
                         size_t start, size_t end) {
	duckdb::vector<StringPiece> target_groups;
	auto group_count = duckdb::UnsafeNumericCast<size_t>(regex.NumberOfCapturingGroups() + 1);
	target_groups.resize(group_count);
	match.groups.clear();
	if (!regex.Match(StringPiece(input_data, input_size), start, end, anchor, target_groups.data(),
	                 duckdb::UnsafeNumericCast<int>(group_count))) {
		return false;
	}
	for (auto &group : target_groups) {
		GroupMatch group_match;
		group_match.text = group.ToString();
		group_match.position = group.data() != nullptr ? duckdb::NumericCast<uint32_t>(group.data() - input_data) : 0;
		match.groups.emplace_back(group_match);
	}
	return true;
}